

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O0

void __thiscall BinNE<0,_0,_1>::BinNE(BinNE<0,_0,_1> *this,IntView<0> _x,IntView<0> _y,BoolView *_r)

{
  _func_int **in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  Propagator *in_RDI;
  undefined8 in_R8;
  BoolView *in_R9;
  BoolView *in_stack_ffffffffffffff98;
  Propagator *in_stack_ffffffffffffffa0;
  Tchar *this_00;
  Propagator *p;
  IntView<0> *in_stack_ffffffffffffffc0;
  
  Propagator::Propagator(in_stack_ffffffffffffffa0);
  Checker::Checker((Checker *)in_stack_ffffffffffffffa0);
  in_RDI->_vptr_Propagator = (_func_int **)&PTR__BinNE_0031f5b0;
  in_RDI[1]._vptr_Propagator = (_func_int **)&DAT_0031f618;
  p = (Propagator *)&in_RDI[1].prop_id;
  in_RDI[1].prop_id = (int)in_RSI;
  in_RDI[1].priority = (int)((ulong)in_RSI >> 0x20);
  in_RDI[1].satisfied = (Tchar)(char)in_RDX;
  in_RDI[1].in_queue = (bool)(char)((ulong)in_RDX >> 8);
  *(int6 *)&in_RDI[1].field_0x12 = (int6)((ulong)in_RDX >> 0x10);
  in_RDI[2]._vptr_Propagator = in_RCX;
  in_RDI[2].prop_id = (int)in_R8;
  in_RDI[2].priority = (int)((ulong)in_R8 >> 0x20);
  this_00 = &in_RDI[2].satisfied;
  BoolView::BoolView((BoolView *)this_00,in_stack_ffffffffffffff98);
  IntView<0>::attach(in_stack_ffffffffffffffc0,in_RDI,(int)((ulong)in_R9 >> 0x20),(int)in_R9);
  IntView<0>::attach(in_stack_ffffffffffffffc0,in_RDI,(int)((ulong)in_R9 >> 0x20),(int)in_R9);
  BoolView::attach(in_R9,p,(int)((ulong)this_00 >> 0x20),(int)this_00);
  return;
}

Assistant:

BinNE(IntView<U> _x, IntView<V> _y, BoolView _r = bv_true) : x(_x), y(_y), r(std::move(_r)) {
		x.attach(this, 0, EVENT_F);
		y.attach(this, 1, EVENT_F);
		if (R != 0) {
			r.attach(this, 2, EVENT_L);
		}
		//		printf("BinNE: %d %d %d\n", U, V, R);
	}